

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_util.h
# Opt level: O2

uint64_t uo_ceil_pow2(uint64_t n)

{
  ulong uVar1;
  
  uVar1 = n - 1 >> 1 | n - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  return (uVar1 >> 0x20 | uVar1) + 1;
}

Assistant:

static inline uint64_t uo_ceil_pow2(
    uint64_t n)
{
    n--;
    n |= n >> 1;
    n |= n >> 2;
    n |= n >> 4;
    n |= n >> 8;
    n |= n >> 16;
    n |= n >> 32;
    n++;

    return n;
}